

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_casts.cpp
# Opt level: O3

BoundCastInfo *
duckdb::DefaultCasts::TimestampMsCastSwitch
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_40;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_38;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_30;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_28;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_20;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_18;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_10;
  
  switch(target->id_) {
  case DATE:
    local_18._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TemplatedCastLoop<duckdb::timestamp_t,duckdb::date_t,duckdb::CastTimestampMsToDate>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_18,(init_cast_local_state_t)0x0);
    _Var1._M_head_impl = local_18._M_head_impl;
    break;
  case TIME:
    local_20._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TemplatedCastLoop<duckdb::timestamp_t,duckdb::dtime_t,duckdb::CastTimestampMsToTime>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_20,(init_cast_local_state_t)0x0);
    _Var1._M_head_impl = local_20._M_head_impl;
    break;
  case TIMESTAMP:
    local_28._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TemplatedCastLoop<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::CastTimestampMsToUs>
               ,(unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                 *)&local_28,(init_cast_local_state_t)0x0);
    _Var1._M_head_impl = local_28._M_head_impl;
    break;
  case TIMESTAMP_NS:
    local_30._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::
               TemplatedCastLoop<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::CastTimestampMsToNs>
               ,(unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                 *)&local_30,(init_cast_local_state_t)0x0);
    _Var1._M_head_impl = local_30._M_head_impl;
    break;
  case VARCHAR:
    local_10._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,
               VectorCastHelpers::StringCast<duckdb::timestamp_t,duckdb::CastFromTimestampMS>,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_10,(init_cast_local_state_t)0x0);
    _Var1._M_head_impl = local_10._M_head_impl;
    break;
  default:
    if (target->id_ == TIMESTAMP_TZ) {
      local_38._M_head_impl = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TemplatedCastLoop<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::CastTimestampMsToUs>
                 ,(unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                   *)&local_38,(init_cast_local_state_t)0x0);
      _Var1._M_head_impl = local_38._M_head_impl;
      break;
    }
  case TIMESTAMP_SEC:
  case TIMESTAMP_MS:
  case DECIMAL:
  case FLOAT:
  case DOUBLE:
  case CHAR:
    local_40._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,TryVectorNullCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_40,(init_cast_local_state_t)0x0);
    _Var1._M_head_impl = local_40._M_head_impl;
  }
  if (_Var1._M_head_impl != (BoundCastData *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_BoundCastData[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::TimestampMsCastSwitch(BindCastInput &input, const LogicalType &source,
                                                  const LogicalType &target) {
	// now switch on the result type
	switch (target.id()) {
	case LogicalTypeId::VARCHAR:
		// timestamp (ms) to varchar
		return BoundCastInfo(&VectorCastHelpers::StringCast<timestamp_t, duckdb::CastFromTimestampMS>);
	case LogicalTypeId::DATE:
		// timestamp (ms) to date
		return BoundCastInfo(&VectorCastHelpers::TemplatedCastLoop<timestamp_t, date_t, duckdb::CastTimestampMsToDate>);
	case LogicalTypeId::TIME:
		// timestamp (ms) to time
		return BoundCastInfo(
		    &VectorCastHelpers::TemplatedCastLoop<timestamp_t, dtime_t, duckdb::CastTimestampMsToTime>);
	case LogicalTypeId::TIMESTAMP:
		// timestamp (ms) to timestamp (us)
		return BoundCastInfo(
		    &VectorCastHelpers::TemplatedCastLoop<timestamp_t, timestamp_t, duckdb::CastTimestampMsToUs>);
	case LogicalTypeId::TIMESTAMP_NS:
		// timestamp (ms) to timestamp (ns)
		return BoundCastInfo(
		    &VectorCastHelpers::TemplatedCastLoop<timestamp_t, timestamp_t, duckdb::CastTimestampMsToNs>);
	case LogicalTypeId::TIMESTAMP_TZ:
		// timestamp (ms) to timestamp with timezone (us)
		return BoundCastInfo(
		    &VectorCastHelpers::TemplatedCastLoop<timestamp_t, timestamp_t, duckdb::CastTimestampMsToUs>);
	default:
		return TryVectorNullCast;
	}
}